

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

bool argagg::convert::parse_next_component<std::__cxx11::string>
               (char **s,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_arg,
               char delim)

{
  char *__s;
  char *pcVar1;
  undefined7 in_register_00000011;
  string arg_str;
  allocator local_69;
  char *local_68 [2];
  char local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  __s = *s;
  pcVar1 = strchr(__s,(int)CONCAT71(in_register_00000011,delim));
  *s = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)local_68,__s,(allocator *)local_48);
    std::__cxx11::string::string((string *)local_48,local_68[0],&local_69);
    std::__cxx11::string::operator=((string *)out_arg,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    if (local_68[0] == local_58) goto LAB_0014a35c;
  }
  else {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,__s,pcVar1);
    std::__cxx11::string::string((string *)local_48,local_68[0],&local_69);
    std::__cxx11::string::operator=((string *)out_arg,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    *s = *s + 1;
    if (local_68[0] == local_58) goto LAB_0014a35c;
  }
  operator_delete(local_68[0]);
LAB_0014a35c:
  return pcVar1 != (char *)0x0;
}

Assistant:

bool parse_next_component(
    const char*& s,
    T& out_arg,
    const char delim)
  {
    const char* begin = s;
    s = std::strchr(s, delim);
    if (s == nullptr) {
      std::string arg_str(begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      return false;
    } else {
      std::string arg_str(begin, s - begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      s += 1;
      return true;
    }
  }